

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheVk::ShaderResourceCacheVk
          (ShaderResourceCacheVk *this,ResourceCacheContentType ContentType)

{
  string msg;
  string local_20;
  
  (this->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>._M_i = 0;
  (this->m_pMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_pMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  this->m_NumSets = 0;
  this->m_NumDynamicBuffers = 0;
  *(uint *)&this->field_0x1c = (uint)ContentType << 0x1f;
  (this->m_DbgInitializedResources).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_DbgInitializedResources).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_DbgInitializedResources).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (SRB < ContentType) {
    FormatString<char[26],char[32]>
              (&local_20,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"GetContentType() == ContentType",
               (char (*) [32])(ulong)((uint)ContentType << 0x1f));
    DebugAssertionFailed
              (local_20._M_dataplus._M_p,"ShaderResourceCacheVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0x4f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_20._M_dataplus._M_p != &local_20.field_2) {
      operator_delete(local_20._M_dataplus._M_p,local_20.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit ShaderResourceCacheVk(ResourceCacheContentType ContentType) noexcept :
        m_TotalResources{0},
        m_ContentType{static_cast<Uint32>(ContentType)}
    {
        VERIFY_EXPR(GetContentType() == ContentType);
    }